

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O2

translation_t *
opengv::absolute_pose::p2p
          (translation_t *__return_storage_ptr__,AbsoluteAdapterBase *adapter,size_t index0,
          size_t index1)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar35;
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  Vector3d n3;
  undefined1 local_248 [8];
  LhsNested LStack_240;
  scalar_constant_op<double> sStack_238;
  variable_if_dynamic<long,__1> vStack_230;
  variable_if_dynamic<long,__1> vStack_228;
  PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *pPStack_220;
  double dStack_218;
  double dStack_210;
  double local_208;
  Vector3d n1;
  double local_1d8;
  Matrix3d Q;
  rotation_t N;
  Vector3d temp1;
  undefined1 local_118 [16];
  undefined8 local_108;
  Vector3d temp2;
  Vector3d e1;
  rotation_t T;
  undefined1 local_88 [16];
  undefined8 local_78;
  Matrix<double,_3,_1,_0,_3,_1> local_68;
  double local_48 [3];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  (*adapter->_vptr_AbsoluteAdapterBase[2])(&e1);
  (*adapter->_vptr_AbsoluteAdapterBase[2])(&local_68,adapter,index1);
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       e1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
  auVar38._8_8_ =
       e1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  auVar38._0_8_ =
       e1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  auVar14._8_8_ =
       local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [2];
  auVar14._0_8_ =
       local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [1];
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [0];
  auVar45._8_8_ =
       local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [2];
  auVar45._0_8_ =
       local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [2];
  auVar12._8_8_ =
       e1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  auVar12._0_8_ =
       e1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  auVar16 = vunpcklpd_avx(auVar38,auVar31);
  auVar17 = vunpcklpd_avx(auVar45,auVar17);
  auVar39._0_8_ =
       local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [1] * auVar16._0_8_;
  auVar39._8_8_ =
       local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [2] * auVar16._8_8_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [0] * e1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [1];
  auVar5 = vfmsub231sd_fma(auVar16,auVar31,auVar14);
  auVar16 = vfmsub213pd_fma(auVar17,auVar12,auVar39);
  local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       auVar16._0_8_;
  local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       auVar16._8_8_;
  local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       auVar5._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [2] * local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
             array[2] +
       local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [0] * local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
             array[0] +
       local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [1] * local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
             array[1];
  auVar16 = vsqrtsd_avx(auVar19,auVar19);
  sStack_238.m_other = auVar16._0_8_;
  local_248 = (undefined1  [8])&local_68;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (&local_68,
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_248);
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [0];
  auVar40._8_8_ =
       local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [2];
  auVar40._0_8_ =
       local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [2];
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       e1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
  auVar46._8_8_ =
       e1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  auVar46._0_8_ =
       e1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  auVar15._8_8_ =
       local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [2];
  auVar15._0_8_ =
       local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [1];
  auVar13._8_8_ =
       e1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  auVar13._0_8_ =
       e1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  auVar16 = vunpcklpd_avx(auVar40,auVar32);
  auVar17 = vunpcklpd_avx(auVar46,auVar20);
  auVar41._0_8_ =
       e1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] *
       auVar16._0_8_;
  auVar41._8_8_ =
       e1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       auVar16._8_8_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       e1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [1];
  auVar16 = vfmsub231sd_fma(auVar21,auVar32,auVar13);
  local_118 = vfmsub213pd_fma(auVar17,auVar15,auVar41);
  local_108 = auVar16._0_8_;
  vStack_230.m_value = 0;
  vStack_228.m_value = 0;
  pPStack_220 = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)0x1;
  local_248 = (undefined1  [8])&T;
  sStack_238.m_other = (double)&T;
  N.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&e1;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)local_248,
             (Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&N);
  local_248 = (undefined1  [8])
              (T.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
              + 1);
  N.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)local_118;
  vStack_230.m_value = 1;
  vStack_228.m_value = 0;
  pPStack_220 = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)0x1;
  sStack_238.m_other = (double)&T;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)local_248,
             (Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&N);
  local_248 = (undefined1  [8])
              (T.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
              + 2);
  vStack_230.m_value = 2;
  vStack_228.m_value = 0;
  pPStack_220 = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)0x1;
  sStack_238.m_other = (double)&T;
  N.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_68;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)local_248,
             (Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&N);
  (*adapter->_vptr_AbsoluteAdapterBase[6])(&N,adapter,index1);
  (*adapter->_vptr_AbsoluteAdapterBase[6])(&Q,adapter,index0);
  local_248 = (undefined1  [8])&N;
  LStack_240.m_matrix = &Q;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&n1,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_248);
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       n1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       n1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] +
       n1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       n1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] +
       n1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] *
       n1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  auVar16 = vsqrtsd_avx(auVar22,auVar22);
  sStack_238.m_other = auVar16._0_8_;
  local_248 = (undefined1  [8])&n1;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)&n1,
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_248);
  auVar5._8_8_ = n1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
  auVar5._0_8_ = n1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0];
  auVar42._8_8_ = 0x7fffffffffffffff;
  auVar42._0_8_ = 0x7fffffffffffffff;
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       n1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  auVar16 = vandpd_avx(auVar5,auVar42);
  auVar17 = vshufps_avx(auVar16,auVar16,0x4e);
  dVar36 = auVar16._0_8_;
  dVar35 = auVar17._0_8_;
  if ((dVar36 <= dVar35) || (auVar16 = vandpd_avx(auVar33,auVar42), dVar36 <= auVar16._0_8_)) {
    if ((dVar35 <= dVar36) ||
       (auVar7._8_8_ = 0x7fffffffffffffff, auVar7._0_8_ = 0x7fffffffffffffff,
       auVar16 = vandpd_avx512vl(auVar33,auVar7), dVar35 <= auVar16._0_8_)) {
      auVar9._8_8_ = 0x8000000000000000;
      auVar9._0_8_ = 0x8000000000000000;
      auVar16 = vxorpd_avx512vl(auVar5,auVar9);
      n3.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
           auVar16._0_8_ /
           n1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
      ;
      n3.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
           1.0;
      n3.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
           0.0;
    }
    else {
      auVar8._8_8_ = 0x8000000000000000;
      auVar8._0_8_ = 0x8000000000000000;
      auVar17 = vxorpd_avx512vl(auVar33,auVar8);
      auVar16 = vshufpd_avx(auVar5,auVar5,1);
      n3.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
           1.0;
      n3.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
           0.0;
      n3.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
           auVar17._0_8_ / auVar16._0_8_;
    }
  }
  else {
    n3.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] = 1.0;
    n3.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] = 0.0;
    auVar16 = vshufpd_avx(auVar5,auVar5,1);
    auVar6._8_8_ = 0x8000000000000000;
    auVar6._0_8_ = 0x8000000000000000;
    auVar16 = vxorpd_avx512vl(auVar16,auVar6);
    n3.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         auVar16._0_8_ /
         n1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
  }
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       n3.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       n3.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] +
       n3.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       n3.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] +
       n3.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] *
       n3.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  auVar16 = vsqrtsd_avx(auVar23,auVar23);
  sStack_238.m_other = auVar16._0_8_;
  local_248 = (undefined1  [8])&n3;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (&n3,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)local_248);
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       n3.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
  auVar43._8_8_ =
       n3.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  auVar43._0_8_ =
       n3.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       n1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
  auVar47._8_8_ =
       n1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  auVar47._0_8_ =
       n1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  auVar10._8_8_ =
       n3.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  auVar10._0_8_ =
       n3.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  auVar11._8_8_ =
       n1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  auVar11._0_8_ =
       n1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  auVar16 = vunpcklpd_avx(auVar43,auVar34);
  auVar17 = vunpcklpd_avx(auVar47,auVar24);
  auVar44._0_8_ =
       n1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] *
       auVar16._0_8_;
  auVar44._8_8_ =
       n1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       auVar16._8_8_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       n1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       n3.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  auVar16 = vfmsub231sd_fma(auVar25,auVar34,auVar11);
  local_88 = vfmsub213pd_fma(auVar17,auVar10,auVar44);
  local_78 = auVar16._0_8_;
  vStack_230.m_value = 0;
  vStack_228.m_value = 0;
  pPStack_220 = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)0x1;
  local_248 = (undefined1  [8])&N;
  sStack_238.m_other = (double)&N;
  Q.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&n1;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)local_248,
             (Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&Q);
  local_248 = (undefined1  [8])
              (N.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
              + 1);
  vStack_230.m_value = 1;
  vStack_228.m_value = 0;
  pPStack_220 = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)0x1;
  sStack_238.m_other = (double)&N;
  Q.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)local_88;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)local_248,
             (Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&Q);
  local_248 = (undefined1  [8])
              (N.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
              + 2);
  vStack_230.m_value = 2;
  vStack_228.m_value = 0;
  pPStack_220 = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)0x1;
  sStack_238.m_other = (double)&N;
  Q.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&n3;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)local_248,
             (Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&Q);
  local_208 = (adapter->_R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[8];
  temp1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)&T;
  local_248 = (undefined1  [8])
              (adapter->_R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[0];
  LStack_240.m_matrix =
       (non_const_type)
       (adapter->_R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
       array[1];
  sStack_238.m_other =
       (adapter->_R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
       array[2];
  vStack_230.m_value =
       (long)(adapter->_R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[3];
  vStack_228.m_value =
       (long)(adapter->_R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[4];
  pPStack_220 = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)
                (adapter->_R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                .m_data.array[5];
  dStack_218 = (adapter->_R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[6];
  dStack_210 = (adapter->_R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[7];
  temp1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (double)local_248;
  temp1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (double)&N;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&Q,
             (DenseBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>
              *)&temp1);
  (*adapter->_vptr_AbsoluteAdapterBase[6])(&temp2,adapter,index1);
  pdVar1 = (&local_68)[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
           m_data.array + 1;
  (*adapter->_vptr_AbsoluteAdapterBase[6])(pdVar1,adapter,index0);
  local_248 = (undefined1  [8])&temp2;
  LStack_240.m_matrix = (non_const_type)pdVar1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&temp1,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_248);
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       temp1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       * temp1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
         [2] + temp1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
               array[0] *
               temp1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
               array[0] +
               temp1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
               array[1] *
               temp1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
               array[1];
  auVar16 = vsqrtsd_avx(auVar26,auVar26);
  (*adapter->_vptr_AbsoluteAdapterBase[2])
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&temp2,adapter,index1);
  auVar29._0_8_ =
       Eigen::internal::
       dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
       ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&e1,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&temp2);
  auVar29._8_56_ = extraout_var;
  auVar27 = auVar29._0_16_;
  dVar35 = 1.0 / (1.0 - auVar29._0_8_ * auVar29._0_8_) + -1.0;
  if (dVar35 < 0.0) {
    auVar30._0_8_ = sqrt(dVar35);
    auVar30._8_56_ = extraout_var_00;
    auVar17 = auVar30._0_16_;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = auVar29._0_8_;
  }
  else {
    auVar28._8_8_ = 0;
    auVar28._0_8_ = dVar35;
    auVar17 = vsqrtsd_avx(auVar28,auVar28);
  }
  uVar3 = vcmpsd_avx512f(auVar27,ZEXT816(0) << 0x40,1);
  bVar4 = (bool)((byte)uVar3 & 1);
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       Q.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1];
  auVar18._0_8_ =
       (ulong)bVar4 * (auVar17._0_8_ ^ 0x8000000000000000) + (ulong)!bVar4 * auVar17._0_8_;
  auVar18._8_8_ = auVar17._8_8_;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = Q.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                 array[0];
  auVar17 = vfmsub213sd_fma(auVar37,auVar18,auVar2);
  local_1d8 = auVar16._0_8_;
  sStack_238.m_other = auVar17._0_8_ * -local_1d8;
  dStack_218 = 0.0;
  dStack_210 = 0.0;
  local_208 = 4.94065645841247e-324;
  vStack_230.m_value = (long)&Q;
  pPStack_220 = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&Q;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)__return_storage_ptr__,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>_>
              *)local_248);
  (*adapter->_vptr_AbsoluteAdapterBase[6])(pdVar1,adapter,index0);
  LStack_240.m_matrix = &N;
  local_248 = (undefined1  [8])pdVar1;
  sStack_238.m_other = (double)__return_storage_ptr__;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
            (__return_storage_ptr__,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)local_248);
  if (((NAN((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[0])) ||
      (NAN((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
           m_storage.m_data.array[1]))) ||
     (NAN((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[2]))) {
    LStack_240.m_matrix = (non_const_type)0x0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
              (__return_storage_ptr__,
               (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                *)local_248);
  }
  return __return_storage_ptr__;
}

Assistant:

opengv::translation_t
opengv::absolute_pose::p2p(
    const AbsoluteAdapterBase & adapter,
    size_t index0,
    size_t index1)
{
  Eigen::Vector3d e1 = adapter.getBearingVector(index0);
  Eigen::Vector3d e3 = adapter.getBearingVector(index1);
  e3 = e1.cross(e3);
  e3 = e3/e3.norm();
  Eigen::Vector3d e2 = e3.cross(e1);

  rotation_t T;
  T.row(0) = e1.transpose();
  T.row(1) = e2.transpose();
  T.row(2) = e3.transpose();

  Eigen::Vector3d n1 = adapter.getPoint(index1) - adapter.getPoint(index0);
  n1 = n1/n1.norm();
  Eigen::Vector3d n3;
  if( (fabs(n1[0]) > fabs(n1[1])) && (fabs(n1[0]) > fabs(n1[2])) )
  {
    n3[1] = 1.0;
    n3[2] = 0.0;
    n3[0] = -n1[1]/n1[0];
  }
  else
  {
    if( (fabs(n1[1]) > fabs(n1[0])) && (fabs(n1[1]) > fabs(n1[2])) )
    {
      n3[2] = 1.0;
      n3[0] = 0.0;
      n3[1] = -n1[2]/n1[1];
    }
    else
    {
      n3[0] = 1.0;
      n3[1] = 0.0;
      n3[2] = -n1[0]/n1[2];
    }
  }
  n3 = n3 / n3.norm();
  Eigen::Vector3d n2 = n3.cross(n1);

  rotation_t N;
  N.row(0) = n1.transpose();
  N.row(1) = n2.transpose();
  N.row(2) = n3.transpose();

  Eigen::Matrix3d Q = T * adapter.getR().transpose() * N.transpose();
  Eigen::Vector3d temp1 = adapter.getPoint(index1) - adapter.getPoint(index0);
  double d_12 = temp1.norm();

  Eigen::Vector3d temp2 = adapter.getBearingVector(index1);
  double cos_beta = e1.dot(temp2);
  double b = 1/( 1 - pow( cos_beta, 2 ) ) - 1;

  if( cos_beta < 0 )
    b = -sqrt(b);
  else
    b = sqrt(b);

  double temp3 = d_12 * ( Q(1,0) * b - Q(0,0) );

  translation_t solution = -temp3 * Q.row(0).transpose();
  solution = adapter.getPoint(index0) + N.transpose()*solution;

  if(
    solution(0,0) != solution(0,0) ||
    solution(1,0) != solution(1,0) ||
    solution(2,0) != solution(2,0) )
    solution = Eigen::Vector3d::Zero();

  return solution;
}